

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O1

void __thiscall
cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
          (cmGeneratorExpressionDAGChecker *this,string *target,string *property,
          GeneratorExpressionContent *content,cmGeneratorExpressionDAGChecker *parent)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  Snapshot snapshot;
  cmCommandContext local_70;
  Snapshot local_48;
  
  this->Parent = parent;
  (this->Target)._M_dataplus._M_p = (pointer)&(this->Target).field_2;
  pcVar3 = (target->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Target,pcVar3,pcVar3 + target->_M_string_length);
  (this->Property)._M_dataplus._M_p = (pointer)&(this->Property).field_2;
  pcVar3 = (property->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Property,pcVar3,pcVar3 + property->_M_string_length);
  p_Var1 = &(this->Seen)._M_t._M_impl.super__Rb_tree_header;
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Content = content;
  cmState::Snapshot::Snapshot(&local_48,(cmState *)0x0);
  paVar2 = &local_70.Name.field_2;
  local_70.Name._M_string_length = 0;
  local_70.Name.field_2._M_local_buf[0] = '\0';
  local_70.Line = 0;
  snapshot.Position.Tree = local_48.Position.Tree;
  snapshot.State = local_48.State;
  snapshot.Position.Position = local_48.Position.Position;
  local_70.Name._M_dataplus._M_p = (pointer)paVar2;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,snapshot,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.Name._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.Name._M_dataplus._M_p,
                    CONCAT71(local_70.Name.field_2._M_allocated_capacity._1_7_,
                             local_70.Name.field_2._M_local_buf[0]) + 1);
  }
  this->TransitivePropertiesOnly = false;
  Initialize(this);
  return;
}

Assistant:

cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker(
                const std::string &target,
                const std::string &property,
                const GeneratorExpressionContent *content,
                cmGeneratorExpressionDAGChecker *parent)
  : Parent(parent), Target(target), Property(property),
    Content(content), Backtrace(), TransitivePropertiesOnly(false)
{
  Initialize();
}